

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-attach-file.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  char *pcVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  long *plVar8;
  size_t sVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  element_type *peVar12;
  long *extraout_RAX;
  undefined8 extraout_RAX_00;
  element_type *in_RCX;
  element_type **ppeVar13;
  long *plVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var15;
  ulong *puVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *extraout_RDX_00;
  element_type *peVar17;
  ulong uVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  element_type *peVar20;
  long lVar21;
  QPDFObjectHandle QVar22;
  QPDFObjectHandle QVar23;
  QPDFObjectHandle QVar24;
  QPDFObjectHandle QVar25;
  QPDFObjectHandle QVar26;
  QPDF q;
  size_type __dnew;
  QPDFFileSpecObjectHelper fs;
  string key;
  QPDFEmbeddedFileDocumentHelper efdh;
  QPDFObjectHandle page;
  QPDFObjectHandle apdict;
  QPDFObjectHandle contents;
  QPDFObjectHandle ap;
  QPDFObjectHandle annot;
  QPDFObjectHandle resources;
  QPDFObjectHandle f1;
  QPDFObjectHandle local_390;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_380;
  ulong uStack_378;
  QPDF local_370 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  long local_358;
  undefined8 uStack_350;
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [2];
  allocator<char> local_30a;
  allocator<char> local_309;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_2c8;
  long local_2c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_288;
  long local_280;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  long lStack_270;
  element_type *local_268;
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  undefined1 local_240 [32];
  element_type *local_220;
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  undefined1 local_1e8 [16];
  element_type *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  element_type *local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0 [2];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  string local_170 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150 [2];
  size_type local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  long *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  long local_120 [2];
  string local_110 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  string local_100 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  string local_f0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  QPDF local_e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  element_type local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string local_c0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  QPDF local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  element_type local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  char local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc < 2) {
    local_268 = (element_type *)0x0;
    local_218 = (element_type *)0x0;
    local_220 = (element_type *)0x0;
    local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar17 = (element_type *)0x0;
  }
  else {
    lVar21 = 1;
    peVar17 = (element_type *)0x0;
    local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_220 = (element_type *)0x0;
    local_218 = (element_type *)0x0;
    local_268 = (element_type *)0x0;
    do {
      pcVar2 = argv[lVar21];
      peVar20 = (element_type *)argv[lVar21 + 1];
      iVar7 = strcmp(pcVar2,"--infile");
      if (iVar7 == 0) {
        local_348._0_8_ = local_348 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,"--infile takes an argument","");
        if (peVar20 == (element_type *)0x0) {
          usage((string *)local_348);
LAB_00103cb6:
          usage((string *)local_348);
LAB_00103cc0:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e8,pcVar2,(allocator<char> *)local_240);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1e8,0,(char *)0x0,0x1050ca);
          local_348._0_8_ = local_348 + 0x10;
          peVar17 = (element_type *)*plVar8;
          in_RCX = (element_type *)(plVar8 + 2);
          if (peVar17 != in_RCX) goto LAB_00103d65;
          local_338[0]._0_8_ = *(undefined8 *)in_RCX;
          local_338[0]._8_8_ = plVar8[3];
          goto LAB_00103d72;
        }
        peVar17 = peVar20;
        peVar3 = local_268;
        peVar4 = local_220;
        peVar5 = local_218;
        _Var6._M_pi = local_210._M_pi;
        if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
          operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
          peVar3 = local_268;
          peVar4 = local_220;
          peVar5 = local_218;
          _Var6._M_pi = local_210._M_pi;
        }
      }
      else {
        iVar7 = strcmp(pcVar2,"--password");
        if (iVar7 == 0) {
          local_348._0_8_ = local_348 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"--password takes an argument","");
          if (peVar20 == (element_type *)0x0) goto LAB_00103cb6;
          peVar3 = local_268;
          peVar4 = local_220;
          peVar5 = local_218;
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar20;
          if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
            operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
            peVar3 = local_268;
            peVar4 = local_220;
            peVar5 = local_218;
          }
        }
        else {
          iVar7 = strcmp(pcVar2,"--attachment");
          if (iVar7 == 0) {
            local_348._0_8_ = local_348 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,"--attachment takes an argument","");
            if (peVar20 == (element_type *)0x0) {
LAB_00103d26:
              usage((string *)local_348);
LAB_00103d30:
              usage((string *)local_348);
              goto LAB_00103d3a;
            }
            peVar3 = local_268;
            peVar4 = peVar20;
            peVar5 = local_218;
            _Var6._M_pi = local_210._M_pi;
            if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
              operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
              peVar3 = local_268;
              peVar5 = local_218;
              _Var6._M_pi = local_210._M_pi;
            }
          }
          else {
            iVar7 = strcmp(pcVar2,"--outfile");
            if (iVar7 == 0) {
              local_348._0_8_ = local_348 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_348,"--outfile takes an argument","");
              if (peVar20 == (element_type *)0x0) goto LAB_00103d30;
              peVar3 = peVar20;
              peVar4 = local_220;
              peVar5 = local_218;
              _Var6._M_pi = local_210._M_pi;
              if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
                operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
                peVar4 = local_220;
                peVar5 = local_218;
                _Var6._M_pi = local_210._M_pi;
              }
            }
            else {
              iVar7 = strcmp(pcVar2,"--mimetype");
              if (iVar7 != 0) goto LAB_00103cc0;
              local_348._0_8_ = local_348 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_348,"--mimetype takes an argument","");
              if (peVar20 == (element_type *)0x0) {
                usage((string *)local_348);
                goto LAB_00103d26;
              }
              peVar3 = local_268;
              peVar4 = local_220;
              peVar5 = peVar20;
              _Var6._M_pi = local_210._M_pi;
              if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
                operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
                peVar3 = local_268;
                peVar4 = local_220;
                _Var6._M_pi = local_210._M_pi;
              }
            }
          }
        }
      }
      local_210._M_pi = _Var6._M_pi;
      local_218 = peVar5;
      local_220 = peVar4;
      local_268 = peVar3;
      lVar21 = lVar21 + 2;
    } while ((int)lVar21 < argc);
  }
  peVar20 = local_220;
  if (((peVar17 == (element_type *)0x0) || (local_220 == (element_type *)0x0)) ||
     (local_268 == (element_type *)0x0)) {
LAB_00103d3a:
    peVar20 = (element_type *)(local_348 + 0x10);
    local_348._0_8_ = peVar20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"required arguments were not provided","");
    usage((string *)local_348);
    plVar8 = extraout_RAX;
    peVar17 = extraout_RDX_00;
LAB_00103d65:
    local_338[0]._0_8_ = *(undefined8 *)in_RCX;
    local_348._0_8_ = peVar17;
LAB_00103d72:
    local_348._8_8_ = plVar8[1];
    *plVar8 = (long)in_RCX;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    usage((string *)local_348);
    if ((element_type *)local_348._0_8_ != peVar20) {
      operator_delete((void *)local_348._0_8_,local_338[0]._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX_00);
  }
  QPDF::QPDF(local_370);
  QPDF::processFile((char *)local_370,(char *)peVar17);
  operator____qpdf(local_90,0x1051ae);
  QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370;
  QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_80;
  QPDF::makeIndirectObject(QVar22);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_240,0,(char *)0x0,0x10520e);
  ppeVar13 = (element_type **)(plVar8 + 2);
  if ((element_type **)*plVar8 == ppeVar13) {
    local_1d8 = *ppeVar13;
    _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[3];
    local_1e8._0_8_ = &local_1d8;
  }
  else {
    local_1d8 = *ppeVar13;
    local_1e8._0_8_ = (element_type **)*plVar8;
  }
  local_1e8._8_8_ = plVar8[1];
  *plVar8 = (long)ppeVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_1e8);
  pcVar1 = local_348 + 0x10;
  plVar14 = plVar8 + 2;
  if ((long *)*plVar8 == plVar14) {
    local_338[0]._0_8_ = *plVar14;
    local_338[0]._8_8_ = plVar8[3];
    local_348._0_8_ = pcVar1;
  }
  else {
    local_338[0]._0_8_ = *plVar14;
    local_348._0_8_ = (long *)*plVar8;
  }
  local_348._8_8_ = plVar8[1];
  *plVar8 = (long)plVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((ulong)local_380 & 0xffffffffffffff00);
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  QPDFObjectHandle::parse(local_b0,(string *)local_370,(string *)local_348);
  QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370;
  QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_a0;
  QPDF::makeIndirectObject(QVar23);
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  if ((pointer)local_348._0_8_ != pcVar1) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338[0]._M_allocated_capacity + 1));
  }
  if ((element_type **)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8 + 1));
  }
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348,(char *)peVar20,(allocator<char> *)local_1e8);
  QUtil::path_basename((string *)local_240);
  if ((pointer)local_348._0_8_ != pcVar1) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338[0]._M_allocated_capacity + 1));
  }
  pcVar2 = whoami;
  if (whoami == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x108080);
  }
  else {
    sVar9 = strlen(whoami);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": attaching ",0xc);
  sVar9 = strlen((char *)peVar20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)peVar20,sVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," as ",4);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_240._0_8_,local_240._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e8,(char *)peVar20,(allocator<char> *)&local_390);
  QPDFFileSpecObjectHelper::createFileSpec
            ((QPDF *)local_348,(string *)local_370,(string *)local_240);
  if ((element_type **)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8 + 1));
  }
  peVar17 = local_218;
  if (local_218 != (element_type *)0x0) {
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((ulong)local_380 & 0xffffffffffffff00);
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_380;
    QPDFFileSpecObjectHelper::getEmbeddedFileStream(local_c0);
    QVar26.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar26.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c0;
    QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)local_1e8,QVar26)
    ;
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
    if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)&local_380) {
      operator_delete(local_390.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_380 + 1));
    }
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_380;
    sVar9 = strlen((char *)peVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,peVar17,peVar17 + sVar9);
    QPDFEFStreamObjectHelper::setSubtype((string *)local_1e8);
    if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)&local_380) {
      operator_delete(local_390.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      (ulong)(local_380 + 1));
    }
    QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper((QPDFEFStreamObjectHelper *)local_1e8);
  }
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_1e8,local_370);
  QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
            ((string *)local_1e8,(QPDFFileSpecObjectHelper *)local_240);
  local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x34;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)std::__cxx11::string::_M_create((ulong *)&local_390,(ulong)&local_368);
  local_380 = local_368;
  *(undefined8 *)
   (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x20) = 0x3020300a6c203032;
  *(undefined8 *)
   (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x28) = 0x7220303220303220;
  *(undefined8 *)
   (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x10) = 0x30310a6c20303120;
  *(undefined8 *)
   (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x18) = 0x2030310a6d203020;
  *(undefined8 *)
   local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = 0x310a6d2030312030;
  *(undefined8 *)
   (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 8) = 0x30320a6c20302030;
  *(undefined4 *)
   (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 0x30) = 0xa530a65;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_368;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  [(long)local_368] = (element_type)0x0;
  QPDF::newStream(local_110);
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  QPDFObjectHandle::getDict();
  local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6372756f7365522f;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
  uStack_378 = CONCAT53(uStack_378._3_5_,0x7365);
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  operator____qpdf((char *)&local_368,0x10527c);
  QPDFObjectHandle::replaceKey(local_170,&local_390);
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT26(local_380._6_2_,0x657079542f)
  ;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  operator____qpdf((char *)&local_368,0x105288);
  QPDFObjectHandle::replaceKey(local_170,&local_390);
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x657079746275532f;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  uStack_378 = uStack_378 & 0xffffffffffffff00;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  operator____qpdf((char *)&local_368,0x105291);
  QPDFObjectHandle::replaceKey(local_170,&local_390);
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  local_380 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT26(local_380._6_2_,0x786f42422f)
  ;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  operator____qpdf((char *)&local_368,0x10529d);
  QPDFObjectHandle::replaceKey(local_170,&local_390);
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0x1052ab);
  pp_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar8 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar8 == pp_Var15) {
    local_278 = *pp_Var15;
    lStack_270 = plVar8[3];
    local_288 = &local_278;
  }
  else {
    local_278 = *pp_Var15;
    local_288 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar8;
  }
  local_280 = plVar8[1];
  *plVar8 = (long)pp_Var15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar16 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar16) {
    local_250 = *puVar16;
    lStack_248 = plVar8[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *puVar16;
    local_260 = (ulong *)*plVar8;
  }
  local_258 = plVar8[1];
  *plVar8 = (long)puVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,(char *)peVar20,&local_309);
  QPDFObjectHandle::newUnicodeString(local_f0);
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar18 = 0xf;
  if (local_260 != &local_250) {
    uVar18 = local_250;
  }
  if (uVar18 < (ulong)(local_188 + local_258)) {
    uVar18 = 0xf;
    if (local_190 != &local_180) {
      uVar18 = CONCAT71(uStack_17f,local_180);
    }
    if (uVar18 < (ulong)(local_188 + local_258)) goto LAB_00102fbb;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_260);
  }
  else {
LAB_00102fbb:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_190);
  }
  local_2a8 = &local_298;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_298 = *plVar8;
    lStack_290 = puVar11[3];
  }
  else {
    local_298 = *plVar8;
    local_2a8 = (long *)*puVar11;
  }
  local_2a0 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  pp_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar8 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar8 == pp_Var15) {
    local_2b8 = *pp_Var15;
    lStack_2b0 = plVar8[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *pp_Var15;
    local_2c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar8;
  }
  local_2c0 = plVar8[1];
  *plVar8 = (long)pp_Var15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_140 = local_348._8_8_;
  local_138 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338[0]._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338[0]._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_338[0]._M_allocated_capacity + 8) =
           *(int *)(local_338[0]._M_allocated_capacity + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_338[0]._M_allocated_capacity + 8) =
           *(int *)(local_338[0]._M_allocated_capacity + 8) + 1;
    }
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if (local_2c8 != &local_2b8) {
    p_Var19 = local_2b8;
  }
  if (p_Var19 < local_1a8 + local_2c0) {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_1b0 != (element_type *)local_1a0) {
      p_Var19 = local_1a0[0];
    }
    if (p_Var19 < local_1a8 + local_2c0) goto LAB_00103139;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_2c8);
  }
  else {
LAB_00103139:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_1b0);
  }
  local_308 = &local_2f8;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_2f8 = *plVar8;
    uStack_2f0 = puVar11[3];
  }
  else {
    local_2f8 = *plVar8;
    local_308 = (long *)*puVar11;
  }
  local_300 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_308);
  puVar16 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar16) {
    local_2d8 = *puVar16;
    lStack_2d0 = plVar8[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar16;
    local_2e8 = (ulong *)*plVar8;
  }
  local_2e0 = plVar8[1];
  *plVar8 = (long)puVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,(char *)peVar20,&local_30a);
  QPDFObjectHandle::newUnicodeString(local_100);
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar18 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar18 = local_2d8;
  }
  if (uVar18 < (ulong)(local_158 + local_2e0)) {
    uVar18 = 0xf;
    if (local_160 != local_150) {
      uVar18 = local_150[0];
    }
    if (uVar18 < (ulong)(local_158 + local_2e0)) goto LAB_001032af;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_001032af:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_160);
  }
  local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_358;
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar11 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar11 == p_Var19) {
    local_358 = *(long *)p_Var19;
    uStack_350 = puVar11[3];
  }
  else {
    local_358 = *(long *)p_Var19;
    local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar11;
  }
  local_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar11[1];
  *puVar11 = p_Var19;
  puVar11[1] = 0;
  *p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)0x0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
  peVar12 = (element_type *)(puVar11 + 2);
  if ((element_type *)*puVar11 == peVar12) {
    local_380 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar12;
    uStack_378 = puVar11[3];
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_380;
  }
  else {
    local_380 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar12;
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar11;
  }
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar11[1];
  *puVar11 = peVar12;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_68 = 0;
  local_60 = 0;
  local_70 = &local_60;
  QPDFObjectHandle::parse(local_e0,(string *)local_370,(string *)&local_390);
  QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370;
  QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_d0;
  QPDF::makeIndirectObject(QVar24);
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_1b0 != (element_type *)local_1a0) {
    operator_delete(local_1b0,(ulong)(local_1a0[0] + 1));
  }
  if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,(ulong)(local_2b8 + 1));
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,(ulong)(local_278 + 1));
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x41;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_380;
  peVar12 = (element_type *)std::__cxx11::string::_M_create((ulong *)&local_390,(ulong)&local_368);
  p_Var19 = local_368;
  local_380 = local_368;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar12;
  memcpy(peVar12,"q\nBT\n  102 700 Td\n  /F1 16 Tf\n  (Here is an attachment.) Tj\nET\nQ\n",0x41);
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var19;
  peVar12[(long)p_Var19] = (element_type)0x0;
  QPDF::newStream((string *)&local_130);
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,0x105362);
  local_2a8 = &local_298;
  plVar14 = plVar8 + 2;
  if ((long *)*plVar8 == plVar14) {
    local_298 = *plVar14;
    lStack_290 = plVar8[3];
  }
  else {
    local_298 = *plVar14;
    local_2a8 = (long *)*plVar8;
  }
  local_2a0 = plVar8[1];
  *plVar8 = (long)plVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  pp_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar8 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar8 == pp_Var15) {
    local_2b8 = *pp_Var15;
    lStack_2b0 = plVar8[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *pp_Var15;
    local_2c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar8;
  }
  local_2c0 = plVar8[1];
  *plVar8 = (long)pp_Var15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  QPDFObjectHandle::unparse_abi_cxx11_();
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if (local_2c8 != &local_2b8) {
    p_Var19 = local_2b8;
  }
  if (p_Var19 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_280 + local_2c0)) {
    p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_288 != &local_278) {
      p_Var19 = local_278;
    }
    if (p_Var19 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_280 + local_2c0))
    goto LAB_001037a6;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,(ulong)local_2c8);
  }
  else {
LAB_001037a6:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_288);
  }
  local_308 = &local_2f8;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_2f8 = *plVar8;
    uStack_2f0 = puVar11[3];
  }
  else {
    local_2f8 = *plVar8;
    local_308 = (long *)*puVar11;
  }
  local_300 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_2e8 = &local_2d8;
  puVar16 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar16) {
    local_2d8 = *puVar16;
    lStack_2d0 = plVar8[3];
  }
  else {
    local_2d8 = *puVar16;
    local_2e8 = (ulong *)*plVar8;
  }
  local_2e0 = plVar8[1];
  *plVar8 = (long)puVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  QPDFObjectHandle::unparse_abi_cxx11_();
  uVar18 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar18 = local_2d8;
  }
  if (uVar18 < (ulong)(local_200 + local_2e0)) {
    uVar18 = 0xf;
    if (local_208 != local_1f8) {
      uVar18 = local_1f8[0];
    }
    if ((ulong)(local_200 + local_2e0) <= uVar18) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_2e8);
      goto LAB_00103922;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_208);
LAB_00103922:
  local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_358;
  p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(puVar11 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar11 == p_Var19) {
    local_358 = *(long *)p_Var19;
    uStack_350 = puVar11[3];
  }
  else {
    local_358 = *(long *)p_Var19;
    local_368 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar11;
  }
  local_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar11[1];
  *puVar11 = p_Var19;
  puVar11[1] = 0;
  *p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)0x0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
  peVar12 = (element_type *)(puVar11 + 2);
  if ((element_type *)*puVar11 == peVar12) {
    local_380 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar12;
    uStack_378 = puVar11[3];
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&local_380;
  }
  else {
    local_380 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar12;
    local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)*puVar11;
  }
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar11[1];
  *puVar11 = peVar12;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_188 = 0;
  local_180 = 0;
  local_190 = &local_180;
  QPDFObjectHandle::parse((QPDF *)&local_1b0,(string *)local_370,(string *)&local_390);
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&local_380) {
    operator_delete(local_390.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)(local_380 + 1));
  }
  if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,(ulong)(local_278 + 1));
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,(ulong)(local_2b8 + 1));
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1b0;
  local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_1a8;
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1a8 + 8) = *(int *)(local_1a8 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_1a8 + 8) = *(int *)(local_1a8 + 8) + 1;
    }
  }
  QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_390;
  QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_370;
  QPDF::addPage(QVar25,true);
  if (local_390.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)&local_368,local_370,(char *)local_268);
  QPDFWriter::setQDFMode(SUB81(&local_368,0));
  QPDFWriter::setSuppressOriginalObjectIDs(SUB81(&local_368,0));
  QPDFWriter::setDeterministicID(SUB81(&local_368,0));
  QPDFWriter::write();
  if (local_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360);
  }
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)local_1e8);
  QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper((QPDFFileSpecObjectHelper *)local_348);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  QPDF::~QPDF(local_370);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    char const* infilename = nullptr;
    char const* password = nullptr;
    char const* attachment = nullptr;
    char const* outfilename = nullptr;
    char const* mimetype = nullptr;

    auto check_arg = [](char const* arg, std::string const& msg) {
        if (arg == nullptr) {
            usage(msg);
        }
    };

    for (int i = 1; i < argc; ++i) {
        char* arg = argv[i];
        char* next = argv[i + 1];
        if (strcmp(arg, "--infile") == 0) {
            check_arg(next, "--infile takes an argument");
            infilename = next;
            ++i;
        } else if (strcmp(arg, "--password") == 0) {
            check_arg(next, "--password takes an argument");
            password = next;
            ++i;
        } else if (strcmp(arg, "--attachment") == 0) {
            check_arg(next, "--attachment takes an argument");
            attachment = next;
            ++i;
        } else if (strcmp(arg, "--outfile") == 0) {
            check_arg(next, "--outfile takes an argument");
            outfilename = next;
            ++i;
        } else if (strcmp(arg, "--mimetype") == 0) {
            check_arg(next, "--mimetype takes an argument");
            mimetype = next;
            ++i;
        } else {
            usage("unknown argument " + std::string(arg));
        }
    }
    if (!(infilename && attachment && outfilename)) {
        usage("required arguments were not provided");
    }

    try {
        process(infilename, password, attachment, mimetype, outfilename);
    } catch (std::exception& e) {
        std::cerr << whoami << " exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}